

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void __thiscall ClipperLib::Clipper::AddLocalMinPoly(Clipper *this,TEdge *e1,TEdge *e2,IntPoint *pt)

{
  bool bVar1;
  TEdge *pTVar2;
  long lVar3;
  long lVar4;
  TEdge *e2_00;
  double dVar5;
  
  if ((ABS(e2->dx + 1e+40) < 1e-20) || (e2->dx < e1->dx)) {
    AddOutPt(this,e1,pt);
    e2->outIdx = e1->outIdx;
    e1->side = esLeft;
    e2->side = esRight;
    e2_00 = e1->prevInAEL;
    pTVar2 = e2;
    if (e2_00 != e2) goto LAB_006e4ff3;
  }
  else {
    AddOutPt(this,e2,pt);
    e1->outIdx = e2->outIdx;
    e1->side = esRight;
    e2->side = esLeft;
    e2_00 = e2->prevInAEL;
    bVar1 = e2_00 != e1;
    pTVar2 = e1;
    e1 = e2;
    if (bVar1) goto LAB_006e4ff3;
  }
  e2_00 = pTVar2->prevInAEL;
LAB_006e4ff3:
  if ((e2_00 != (TEdge *)0x0) && (-1 < e2_00->outIdx)) {
    lVar4 = pt->Y;
    if (e2_00->ytop == lVar4) {
      lVar3 = e2_00->xtop;
    }
    else {
      dVar5 = (double)(lVar4 - e2_00->ybot) * e2_00->dx;
      lVar3 = (long)(dVar5 + *(double *)(&DAT_007a7a50 + (ulong)(dVar5 < 0.0) * 8)) + e2_00->xbot;
    }
    if (e1->ytop == lVar4) {
      lVar4 = e1->xtop;
    }
    else {
      dVar5 = (double)(lVar4 - e1->ybot) * e1->dx;
      lVar4 = (long)(dVar5 + *(double *)(&DAT_007a7a50 + (ulong)(dVar5 < 0.0) * 8)) + e1->xbot;
    }
    if ((lVar3 == lVar4) &&
       (bVar1 = SlopesEqual(e1,e2_00,(bool)(this->_vptr_Clipper[-3] + 0x10)
                                           [(long)&(this->m_PolyOuts).
                                                                                                      
                                                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                           ]), bVar1)) {
      AddJoin(this,e1,e2_00,-1,-1);
      return;
    }
  }
  return;
}

Assistant:

void Clipper::AddLocalMinPoly(TEdge *e1, TEdge *e2, const IntPoint &pt)
{
  TEdge *e, *prevE;
  if( NEAR_EQUAL(e2->dx, HORIZONTAL) || ( e1->dx > e2->dx ) )
  {
    AddOutPt( e1, pt );
    e2->outIdx = e1->outIdx;
    e1->side = esLeft;
    e2->side = esRight;
    e = e1;
    if (e->prevInAEL == e2)
      prevE = e2->prevInAEL; 
    else
      prevE = e->prevInAEL;
  } else
  {
    AddOutPt( e2, pt );
    e1->outIdx = e2->outIdx;
    e1->side = esRight;
    e2->side = esLeft;
    e = e2;
    if (e->prevInAEL == e1)
        prevE = e1->prevInAEL;
    else
        prevE = e->prevInAEL;
  }
  if (prevE && prevE->outIdx >= 0 &&
      (TopX(*prevE, pt.Y) == TopX(*e, pt.Y)) &&
        SlopesEqual(*e, *prevE, m_UseFullRange))
          AddJoin(e, prevE, -1, -1);
}